

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# db_impl.cc
# Opt level: O2

Status __thiscall leveldb::DBImpl::DumpRange(DBImpl *this,string *fname,Slice *start,Slice *end)

{
  char *pcVar1;
  Comparator *pCVar2;
  char cVar3;
  int iVar4;
  TableBuilder *this_00;
  long *plVar5;
  uint64_t uVar6;
  char *__tmp;
  _func_int **pp_Var7;
  _func_int **pp_Var8;
  Slice SVar9;
  Slice local_f0;
  DBImpl *local_e0;
  WritableFile *file;
  string *local_d0;
  Slice *local_c8;
  Status local_c0;
  Status local_b8;
  Slice local_b0;
  undefined2 local_a0;
  undefined8 local_98;
  Options options;
  
  (this->super_DB)._vptr_DB = (_func_int **)0x0;
  local_e0 = this;
  (**(code **)(*(long *)fname->_M_string_length + 0x20))
            (&local_b8,(long *)fname->_M_string_length,start,&file);
  Status::~Status(&local_b8);
  Options::Options(&options);
  options.filter_policy = (FilterPolicy *)0x0;
  options.compression = kSnappyCompression;
  this_00 = (TableBuilder *)operator_new(8);
  local_c8 = start;
  TableBuilder::TableBuilder(this_00,&options,file);
  local_a0 = 0x100;
  local_98 = 0;
  local_d0 = fname;
  plVar5 = (long *)(**(code **)((fname->_M_dataplus)._M_p + 0x30))(fname);
  (**(code **)(*plVar5 + 0x28))(plVar5,end);
  while (cVar3 = (**(code **)(*plVar5 + 0x10))(plVar5), pCVar2 = options.comparator, cVar3 != '\0')
  {
    SVar9 = (Slice)(**(code **)(*plVar5 + 0x40))(plVar5);
    local_f0 = SVar9;
    iVar4 = (*pCVar2->_vptr_Comparator[2])(pCVar2,&local_f0);
    if (-1 < iVar4) break;
    SVar9 = (Slice)(**(code **)(*plVar5 + 0x40))(plVar5);
    local_f0 = SVar9;
    SVar9 = (Slice)(**(code **)(*plVar5 + 0x48))(plVar5);
    local_b0 = SVar9;
    TableBuilder::Add(this_00,&local_f0,&local_b0);
    (**(code **)(*plVar5 + 0x30))(plVar5);
  }
  TableBuilder::Finish((TableBuilder *)&local_f0);
  pp_Var7 = (_func_int **)local_f0.data_;
  (local_e0->super_DB)._vptr_DB = (_func_int **)local_f0.data_;
  local_f0.data_ = (char *)0x0;
  Status::~Status((Status *)&local_f0);
  if (pp_Var7 == (_func_int **)0x0) {
    uVar6 = TableBuilder::FileSize(this_00);
    if (uVar6 == 0) {
      __assert_fail("builder->FileSize() > 0",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/CDDSCLab[P]leveldb/db/db_impl.cc"
                    ,0x5c9,
                    "virtual Status leveldb::DBImpl::DumpRange(const std::string &, const Slice &, const Slice &)"
                   );
    }
    TableBuilder::~TableBuilder(this_00);
    operator_delete(this_00);
    (*file->_vptr_WritableFile[5])(&local_f0);
    pp_Var7 = (_func_int **)local_f0.data_;
    (local_e0->super_DB)._vptr_DB = (_func_int **)local_f0.data_;
    local_f0.data_ = (char *)0x0;
    Status::~Status((Status *)&local_f0);
    if (pp_Var7 == (_func_int **)0x0) {
      (*file->_vptr_WritableFile[3])(&local_f0);
      pp_Var7 = (_func_int **)local_f0.data_;
      (local_e0->super_DB)._vptr_DB = (_func_int **)local_f0.data_;
      local_f0.data_ = (char *)0x0;
      Status::~Status((Status *)&local_f0);
    }
  }
  else {
    TableBuilder::~TableBuilder(this_00);
    operator_delete(this_00);
  }
  if (file != (WritableFile *)0x0) {
    (*file->_vptr_WritableFile[1])();
  }
  file = (WritableFile *)0x0;
  (**(code **)(*plVar5 + 0x50))(&local_f0,plVar5);
  pcVar1 = local_f0.data_;
  Status::~Status((Status *)&local_f0);
  pp_Var8 = pp_Var7;
  if ((_func_int **)pcVar1 != (_func_int **)0x0) {
    (**(code **)(*plVar5 + 0x50))(&local_f0,plVar5);
    pp_Var8 = (_func_int **)local_f0.data_;
    (local_e0->super_DB)._vptr_DB = (_func_int **)local_f0.data_;
    local_f0.data_ = (char *)pp_Var7;
    Status::~Status((Status *)&local_f0);
  }
  (**(code **)(*plVar5 + 8))(plVar5);
  if (pp_Var8 != (_func_int **)0x0) {
    (**(code **)(*(long *)local_d0->_M_string_length + 0x40))
              (&local_c0,(long *)local_d0->_M_string_length,local_c8);
    Status::~Status(&local_c0);
  }
  return (Status)(char *)local_e0;
}

Assistant:

Status DBImpl::DumpRange(const std::string& fname,
                         const Slice& start, 
                         const Slice& end) {
    Status s;
    WritableFile* file;
    env_->NewWritableFile(fname, &file);

    Options options;
    options.filter_policy = nullptr;
    options.compression = kSnappyCompression;
    TableBuilder* builder = new TableBuilder(options, file);

    ReadOptions readoption;
    readoption.fill_cache = true;
    Iterator *it = NewIterator(readoption);
    //printf("START DUMPING....\n");
    
    for (it->Seek(start); 
         it->Valid() && options.comparator->Compare(it->key(), end) < 0;
         it->Next()) {
       //printf("\rDUMP FOR KEY: %s\n", it->key().ToString().c_str());
       builder->Add(it->key(), it->value());
    }

    // Finish and check for builder errors
    s = builder->Finish();
    if (s.ok()) {
      assert(builder->FileSize() > 0);
    }
    delete builder;

    // Finish and check for file errors
    if (s.ok()) {
      s = file->Sync();
    }
    if (s.ok()) {
      s = file->Close();
    }
    delete file;
    file = nullptr;

    // Check for input iterator errors
    if (!it->status().ok()) {
      s = it->status();
    }
    delete it;

    if (s.ok()) {
      // Keep it
    } else {
      env_->DeleteFile(fname);
    }
    return s;
}